

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_reservestack(HSQUIRRELVM v,SQInteger nsize)

{
  SQUnsignedInteger newsize;
  SQObjectPtr local_18;
  
  newsize = nsize + v->_top;
  if ((v->_stack)._size < newsize) {
    if (v->_nmetamethodscall != 0) {
      sq_throwerror(v,"cannot resize stack while in a metamethod");
      return -1;
    }
    local_18.super_SQObject._type = OT_NULL;
    local_18.super_SQObject._unVal.pTable = (SQTable *)0x0;
    sqvector<SQObjectPtr>::resize(&v->_stack,newsize,&local_18);
    SQObjectPtr::~SQObjectPtr(&local_18);
  }
  return 0;
}

Assistant:

SQRESULT sq_reservestack(HSQUIRRELVM v,SQInteger nsize)
{
    if (((SQUnsignedInteger)v->_top + nsize) > v->_stack.size()) {
        if(v->_nmetamethodscall) {
            return sq_throwerror(v,_SC("cannot resize stack while in a metamethod"));
        }
        v->_stack.resize(v->_stack.size() + ((v->_top + nsize) - v->_stack.size()));
    }
    return SQ_OK;
}